

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

PMAPPED_VIEW_LIST MAPGetViewForAddress(LPCVOID lpAddress)

{
  PMAPPED_VIEW_LIST pView;
  LIST_ENTRY *pLVar1;
  
  if (lpAddress == (LPCVOID)0x0) {
LAB_0032ad1a:
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    pLVar1 = (LIST_ENTRY *)0x0;
  }
  else {
    pLVar1 = &MappedViewList;
    do {
      pLVar1 = (((PMAPPED_VIEW_LIST)pLVar1)->Link).Flink;
      if (pLVar1 == &MappedViewList) goto LAB_0032ad1a;
    } while (((PMAPPED_VIEW_LIST)pLVar1)->lpAddress != lpAddress);
  }
  return (PMAPPED_VIEW_LIST)pLVar1;
}

Assistant:

static PMAPPED_VIEW_LIST MAPGetViewForAddress( LPCVOID lpAddress )
{       
    if ( NULL == lpAddress )
    {
        ERROR( "lpAddress cannot be NULL\n" );
        return NULL;
    }

    for(LIST_ENTRY *pLink = MappedViewList.Flink;
        pLink != &MappedViewList;
        pLink = pLink->Flink)
    {
        PMAPPED_VIEW_LIST pView = CONTAINING_RECORD(pLink, MAPPED_VIEW_LIST, Link);

        if (pView->lpAddress == lpAddress)
        {
            return pView;
        }
    }
            
    WARN( "No match found.\n" );
    
    return NULL;
}